

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_fe.cc
# Opt level: O0

Matrix<double,_4,_2,_0,_4,_2> *
lf::uscalfe::LinearFELaplaceElementMatrix::DervRefShapFncts
          (Matrix<double,_4,_2,_0,_4,_2> *__return_storage_ptr__,Vector2d *xh)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_> *pCVar2;
  Matrix<double,_4,_2,_0,_4,_2> *other;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8 [3];
  double local_90;
  double local_88;
  int local_80 [2];
  Matrix<double,4,2,0,4,2> local_78 [64];
  CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_> local_38;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *local_18;
  Vector2d *xh_local;
  
  local_80[1] = 4;
  local_80[0] = 2;
  local_18 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)xh;
  xh_local = (Vector2d *)__return_storage_ptr__;
  Eigen::Matrix<double,4,2,0,4,2>::Matrix<int,int>(local_78,local_80 + 1,local_80);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,1);
  local_88 = *pdVar1 + -1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator<<
            (&local_38,(DenseBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_> *)local_78,&local_88);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,0);
  local_90 = *pdVar1 + -1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (&local_38,&local_90);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,1);
  local_a8[0] = 1.0 - *pdVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar2,local_a8);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,0);
  local_b0 = -*pdVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar2,&local_b0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,1);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_(pCVar2,pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_(pCVar2,pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,1);
  local_b8 = -*pdVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar2,&local_b8);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[](local_18,0);
  local_c0 = 1.0 - *pdVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar2,&local_c0);
  other = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::finished(pCVar2);
  Eigen::Matrix<double,_4,_2,_0,_4,_2>::Matrix(__return_storage_ptr__,other);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::~CommaInitializer(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 4, 2> LinearFELaplaceElementMatrix::DervRefShapFncts(
    const Eigen::Vector2d &xh) {
  // clang-format off
  return (Eigen::Matrix<double, 4, 2>(4, 2) <<
	  xh[1] - 1, xh[0] - 1,
	  1 - xh[1],  -xh[0]  ,
	  xh[1]    , xh[0]    ,
	  -xh[1]   , 1 - xh[0]
	  ).finished();
  // clang-format on
}